

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RandomUniformDynamicLayerParams *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::RandomUniformDynamicLayerParams>(Arena *arena)

{
  RandomUniformDynamicLayerParams *pRVar1;
  
  if (arena != (Arena *)0x0) {
    pRVar1 = DoCreateMessage<CoreML::Specification::RandomUniformDynamicLayerParams>(arena);
    return pRVar1;
  }
  pRVar1 = (RandomUniformDynamicLayerParams *)operator_new(0x28);
  CoreML::Specification::RandomUniformDynamicLayerParams::RandomUniformDynamicLayerParams
            (pRVar1,(Arena *)0x0,false);
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }